

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool CombinationKeyTest<Blob<224>,block16>
               (hashfunc<Blob<224>_> hash,int maxlen,block16 *blocks,int blockcount,bool testColl,
               bool testDist,bool drawDiagram)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *this;
  size_type sVar4;
  uint in_ECX;
  block16 *in_RDX;
  uint in_ESI;
  byte in_R8B;
  int in_R9D;
  byte in_stack_00000008;
  bool result;
  block16 *key;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  byte bVar5;
  undefined4 in_stack_ffffffffffffffb4;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_38;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  undefined8 local_18;
  uint local_c;
  hashfunc local_8 [8];
  
  local_1d = in_R8B & 1;
  local_1e = (byte)in_R9D & 1;
  local_1f = in_stack_00000008 & 1;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  printf("Keyset \'Combination\' - up to %d blocks from a set of %d - ",(ulong)in_ESI,(ulong)in_ECX)
  ;
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x1855ba);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_c;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  this = (vector<Blob<224>,_std::allocator<Blob<224>_>_> *)operator_new__(uVar3);
  hashfunc::operator_cast_to_function_pointer(local_8);
  CombinationKeygenRecurse<Blob<224>,block16>
            (in_RDX,in_ECX,in_R9D,(block16 *)CONCAT44(local_1c,in_stack_ffffffffffffff90),
             local_18._4_4_,(pfHash)CONCAT44(local_c,in_stack_ffffffffffffff80),
             (vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (this != (vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x0) {
    operator_delete__(this);
  }
  sVar4 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_38);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar5 = 1;
  bVar2 = TestHashList<Blob<224>>
                    ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
                     hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                     super__Vector_impl_data._M_finish._7_1_,
                     hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                     super__Vector_impl_data._M_finish._6_1_,
                     hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                     super__Vector_impl_data._M_finish._5_1_,
                     hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_1_,
                     hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                     super__Vector_impl_data._M_finish._3_1_);
  bVar5 = bVar2 & bVar5;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(this);
  return (bool)(bVar5 & 1);
}

Assistant:

bool CombinationKeyTest ( hashfunc<hashtype> hash, int maxlen, blocktype* blocks,
                          int blockcount, bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Combination' - up to %d blocks from a set of %d - ",maxlen,blockcount);

  //----------

  std::vector<hashtype> hashes;

  blocktype * key = new blocktype[maxlen];

  CombinationKeygenRecurse(key,0,maxlen,blocks,blockcount,hash,hashes);

  delete [] key;

  printf("%d keys\n",(int)hashes.size());

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}